

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_arange(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t i;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_000012c4 [12];
  
  if (dst->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a55,"fatal error");
  }
  if (dst->nb[0] == 4) {
    fVar1 = (float)dst->op_params[0];
    fVar2 = (float)dst->op_params[2];
    lVar7 = (long)params->ith;
    iVar3 = params->nth;
    auVar8._0_4_ = ((float)dst->op_params[1] - fVar1) / fVar2;
    auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar8 = vroundss_avx(auVar8,auVar8,10);
    lVar4 = ggml_nelements(dst);
    if (lVar4 == (long)auVar8._0_4_) {
      for (; lVar7 < (long)auVar8._0_4_; lVar7 = lVar7 + iVar3) {
        auVar9._0_4_ = (float)lVar7;
        auVar9._4_12_ = in_register_000012c4;
        auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar2),ZEXT416((uint)fVar1));
        *(int *)((long)dst->data + lVar7 * 4) = auVar9._0_4_;
      }
      return;
    }
    pcVar5 = "ggml_nelements(dst) == steps";
    uVar6 = 0x1a43;
  }
  else {
    pcVar5 = "dst->nb[0] == sizeof(float)";
    uVar6 = 0x1a38;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar6,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

void ggml_compute_forward_arange(
    const ggml_compute_params * params,
    ggml_tensor * dst) {
    switch (dst->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_arange_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}